

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

format_decimal_result<char_*>
fmt::v7::detail::format_decimal<char,unsigned_int>(char *out,uint value,int size)

{
  format_decimal_result<char_*> fVar1;
  int iVar2;
  char *end;
  int size_local;
  uint value_local;
  char *out_local;
  
  iVar2 = count_digits(value);
  if (iVar2 <= size) {
    _size_local = out + size;
    for (end._4_4_ = value; 99 < end._4_4_; end._4_4_ = end._4_4_ / 100) {
      _size_local = _size_local + -2;
      copy2(_size_local,basic_data<void>::digits + ((ulong)end._4_4_ % 100) * 2);
    }
    if (end._4_4_ < 10) {
      out_local = _size_local + -1;
      _size_local[-1] = (char)end._4_4_ + '0';
    }
    else {
      out_local = _size_local + -2;
      copy2(out_local,basic_data<void>::digits + (ulong)end._4_4_ * 2);
    }
    fVar1.end = out + size;
    fVar1.begin = out_local;
    return fVar1;
  }
  assert_fail("/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/src/../extern/fmt/include/fmt/format.h"
              ,0x39c,"invalid digit count");
}

Assistant:

inline format_decimal_result<Char*> format_decimal(Char* out, UInt value,
                                                   int size) {
  FMT_ASSERT(size >= count_digits(value), "invalid digit count");
  out += size;
  Char* end = out;
  while (value >= 100) {
    // Integer division is slow so do it for a group of two digits instead
    // of for every digit. The idea comes from the talk by Alexandrescu
    // "Three Optimization Tips for C++". See speed-test for a comparison.
    out -= 2;
    copy2(out, data::digits[value % 100]);
    value /= 100;
  }
  if (value < 10) {
    *--out = static_cast<Char>('0' + value);
    return {out, end};
  }
  out -= 2;
  copy2(out, data::digits[value]);
  return {out, end};
}